

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  shared_ptr<ImageHandler> imgHandler;
  opt_t opt;
  
  opt.filePath._M_dataplus._M_p = (pointer)&opt.filePath.field_2;
  opt.filePath._M_string_length = 0;
  opt.filePath.field_2._M_local_buf[0] = '\0';
  opt.video._M_dataplus._M_p = (pointer)&opt.video.field_2;
  opt.video._M_string_length = 0;
  opt.video.field_2._M_local_buf[0] = '\0';
  opt.detector._M_dataplus._M_p = (pointer)&opt.detector.field_2;
  opt.detector._M_string_length = 0;
  opt.detector.field_2._M_local_buf[0] = '\0';
  opt.effect._M_dataplus._M_p = (pointer)&opt.effect.field_2;
  opt.effect._M_string_length = 0;
  opt.effect.field_2._M_local_buf[0] = '\0';
  opt.image._M_dataplus._M_p = (pointer)&opt.image.field_2;
  opt.image._M_string_length = 0;
  opt.image.field_2._M_local_buf[0] = '\0';
  opt.target._M_dataplus._M_p = (pointer)&opt.target.field_2;
  opt.target._M_string_length = 0;
  opt.target.field_2._M_local_buf[0] = '\0';
  processCommandLine(argc,argv,&opt);
  if (opt.video._M_string_length == 0) {
    iVar1 = 0;
    if (opt.image._M_string_length != 0) {
      std::make_shared<ImageHandler,std::__cxx11::string&,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imgHandler,
                 &opt.detector);
      (**((imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_MediaHandler)._vptr_MediaHandler)
                (imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&opt
                 ,&opt.target);
      (*((imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_MediaHandler)._vptr_MediaHandler[1])();
      (*((imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_MediaHandler)._vptr_MediaHandler[2])
                (imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &opt.image);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else if (opt.image._M_string_length == 0) {
    std::make_shared<VideoHandler,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imgHandler,
               &opt.detector);
    (**((imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_MediaHandler)._vptr_MediaHandler)
              (imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&opt,
               &opt.target);
    (*((imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_MediaHandler)._vptr_MediaHandler[1])();
    (*((imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_MediaHandler)._vptr_MediaHandler[2])
              (imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &opt.video);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&imgHandler.super___shared_ptr<ImageHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  _opt::~_opt(&opt);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    opt_t opt;

    processCommandLine(argc, argv, opt);

    if (!opt.video.empty() && !opt.image.empty()) 
    {
        return -1;
    }
    
    if (!opt.video.empty()) 
    {
        auto videoHandler = std::make_shared<VideoHandler>(opt.detector, opt.effect);
        videoHandler->preProcess(opt.filePath, opt.target);
        videoHandler->doTask();
        videoHandler->postProcess(opt.video);
    } 
    else if (!opt.image.empty()) 
    {
        auto imgHandler = std::make_shared<ImageHandler>(opt.detector, opt.effect);
        imgHandler->preProcess(opt.filePath, opt.target);
        imgHandler->doTask();
        imgHandler->postProcess(opt.image);
    }

    return 0;
}